

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O3

void dynamicgraph::signal_io<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::trace
               (matrix_type *value,ostream *os)

{
  IOFormat *this;
  int iVar1;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [14];
  
  if (signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      trace(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)::row_format == '\0') {
    iVar1 = __cxa_guard_acquire(&signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                                 trace(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)
                                 ::row_format);
    if (iVar1 != 0) {
      local_128._0_8_ = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"\t","");
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"\t","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
      Eigen::IOFormat::IOFormat
                (&trace::row_format,-1,1,(string *)local_128,&local_1a8,&local_1c8,&local_168,
                 &local_188,&local_148,' ');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != local_118) {
        operator_delete((void *)local_128._0_8_,local_118[0]._M_allocated_capacity + 1);
      }
      __cxa_atexit(Eigen::IOFormat::~IOFormat,&trace::row_format,&__dso_handle);
      __cxa_guard_release(&signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                           trace(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)::
                           row_format);
    }
  }
  this = (IOFormat *)(local_128 + 8);
  local_128._0_8_ = value;
  Eigen::IOFormat::IOFormat(this,&trace::row_format);
  Eigen::internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (os,(Matrix<double,__1,__1,_0,__1,__1> *)local_128._0_8_,this);
  Eigen::IOFormat::~IOFormat(this);
  return;
}

Assistant:

inline static void trace(const matrix_type &value, std::ostream &os) {
    static const Eigen::IOFormat row_format(Eigen::StreamPrecision,
                                            Eigen::DontAlignCols, "\t", "\t",
                                            "", "", "", "");
    os << value.format(row_format);
  }